

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O2

Message * __thiscall
ki::protocol::dml::MessageModule::create_message(MessageModule *this,uint8_t message_type)

{
  MessageTemplate *this_00;
  Message *pMVar1;
  ostream *poVar2;
  value_error *this_01;
  string local_1b0;
  ostringstream oss;
  
  this_00 = get_message_template(this,message_type);
  if (this_00 != (MessageTemplate *)0x0) {
    pMVar1 = MessageTemplate::create_message(this_00);
    return pMVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"No message exists with type: ");
  std::operator<<(poVar2,message_type);
  poVar2 = std::operator<<((ostream *)&oss,"(service=");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_protocol_type);
  std::operator<<(poVar2,")");
  this_01 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_01,&local_1b0,DML_INVALID_MESSAGE_TYPE);
  __cxa_throw(this_01,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Message *MessageModule::create_message(uint8_t message_type) const
	{
		auto *message_template = get_message_template(message_type);
		if (!message_template)
		{
			std::ostringstream oss;
			oss << "No message exists with type: " << message_type;
			oss << "(service=" << m_protocol_type << ")";
			throw value_error(oss.str(), value_error::DML_INVALID_MESSAGE_TYPE);
		}

		return message_template->create_message();
	}